

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestViewSampling::resetReferenceColorStorage
          (TextureViewTestViewSampling *this,uint n_layers,uint n_faces,uint n_mipmaps,
          uint n_samples)

{
  _reference_color_storage *this_00;
  Vec4 *pVVar1;
  ulong uVar2;
  uint uVar3;
  Vector<float,_4> *this_01;
  
  this_00 = this->m_reference_color_storage;
  if (this_00 == (_reference_color_storage *)0x0) {
    this_00 = (_reference_color_storage *)operator_new(0x18);
    _reference_color_storage::_reference_color_storage(this_00,n_faces,n_layers,n_mipmaps,n_samples)
    ;
    this->m_reference_color_storage = this_00;
  }
  else {
    this_00->n_faces = n_faces;
    this_00->n_layers = n_layers;
    this_00->n_mipmaps = n_mipmaps;
    this_00->n_samples = n_samples;
  }
  if (this_00->data != (Vec4 *)0x0) {
    operator_delete__(this_00->data);
    this_00 = this->m_reference_color_storage;
    this_00->data = (Vec4 *)0x0;
  }
  uVar3 = n_mipmaps * n_samples * n_faces * n_layers;
  uVar2 = (ulong)uVar3 << 4;
  pVVar1 = (Vec4 *)operator_new__(uVar2);
  this_01 = pVVar1;
  if (uVar3 != 0) {
    do {
      tcu::Vector<float,_4>::Vector(this_01);
      uVar2 = uVar2 - 0x10;
      this_01 = this_01 + 1;
    } while (uVar2 != 0);
    this_00 = this->m_reference_color_storage;
  }
  this_00->data = pVVar1;
  return;
}

Assistant:

void TextureViewTestViewSampling::resetReferenceColorStorage(unsigned int n_layers, unsigned int n_faces,
															 unsigned int n_mipmaps, unsigned int n_samples)
{
	/* Sanity checks */
	DE_ASSERT(n_layers >= 1);
	DE_ASSERT(n_faces >= 1);
	DE_ASSERT(n_mipmaps >= 1);
	DE_ASSERT(n_samples >= 1);

	/* Allocate the descriptor if it's the first time the test will be
	 * attempting to access it */
	if (m_reference_color_storage == DE_NULL)
	{
		m_reference_color_storage = new _reference_color_storage(n_faces, n_layers, n_mipmaps, n_samples);
	}
	else
	{
		/* The descriptor's already there so we only need to update the properties */
		m_reference_color_storage->n_faces   = n_faces;
		m_reference_color_storage->n_layers  = n_layers;
		m_reference_color_storage->n_mipmaps = n_mipmaps;
		m_reference_color_storage->n_samples = n_samples;
	}

	/* If there's any data descriptor found allocated at this point,
	 * release it */
	if (m_reference_color_storage->data != DE_NULL)
	{
		delete[] m_reference_color_storage->data;

		m_reference_color_storage->data = DE_NULL;
	}

	m_reference_color_storage->data = new tcu::Vec4[n_layers * n_faces * n_mipmaps * n_samples];
}